

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O2

void __thiscall ikfast::IkSolution<double>::Validate(IkSolution<double> *this)

{
  byte bVar1;
  pointer pIVar2;
  runtime_error *this_00;
  uchar *puVar3;
  ulong uVar4;
  
  pIVar2 = (this->_vbasesol).
           super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = pIVar2->indices + 1;
  uVar4 = 0;
  do {
    if ((ulong)(((long)(this->_vbasesol).
                       super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) / 0x18) <= uVar4)
    {
      return;
    }
    bVar1 = puVar3[-2];
    if (bVar1 != 0) {
      if (bVar1 == 0xff) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"max solutions for joint not initialized");
LAB_00115884:
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (bVar1 <= puVar3[-1]) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"index >= max solutions for joint");
        goto LAB_00115884;
      }
      if (bVar1 <= *puVar3 && *puVar3 != 0xff) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"2nd index >= max solutions for joint");
        goto LAB_00115884;
      }
    }
    uVar4 = uVar4 + 1;
    puVar3 = puVar3 + 0x18;
  } while( true );
}

Assistant:

virtual void Validate() const {
        for(size_t i = 0; i < _vbasesol.size(); ++i) {
            if( _vbasesol[i].maxsolutions == (unsigned char)-1) {
                throw std::runtime_error("max solutions for joint not initialized");
            }
            if( _vbasesol[i].maxsolutions > 0 ) {
                if( _vbasesol[i].indices[0] >= _vbasesol[i].maxsolutions ) {
                    throw std::runtime_error("index >= max solutions for joint");
                }
                if( _vbasesol[i].indices[1] != (unsigned char)-1 && _vbasesol[i].indices[1] >= _vbasesol[i].maxsolutions ) {
                    throw std::runtime_error("2nd index >= max solutions for joint");
                }
            }
        }
    }